

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void Serialize<AutoFile,std::byte,std::allocator<std::byte>>
               (AutoFile *os,vector<std::byte,_std::allocator<std::byte>_> *v)

{
  long lVar1;
  bool bVar2;
  size_t in_RCX;
  AutoFile *in_RDI;
  long in_FS_OFFSET;
  Span<const_std::byte> SVar3;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_ffffffffffffffc8;
  AutoFile *nSize;
  AutoFile *in_stack_ffffffffffffffd8;
  undefined8 local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  nSize = in_RDI;
  std::vector<std::byte,_std::allocator<std::byte>_>::size(in_stack_ffffffffffffffc8);
  WriteCompactSize<AutoFile>(in_stack_ffffffffffffffd8,(uint64_t)nSize);
  bVar2 = std::vector<std::byte,_std::allocator<std::byte>_>::empty
                    ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffffd8);
  if (!bVar2) {
    SVar3 = MakeByteSpan<std::vector<std::byte,std::allocator<std::byte>>const&>
                      ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffffd8);
    local_20 = (void *)SVar3.m_size;
    AutoFile::write(in_RDI,(int)SVar3.m_data,local_20,in_RCX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::vector<T, A>& v)
{
    if constexpr (BasicByte<T>) { // Use optimized version for unformatted basic bytes
        WriteCompactSize(os, v.size());
        if (!v.empty()) os.write(MakeByteSpan(v));
    } else if constexpr (std::is_same_v<T, bool>) {
        // A special case for std::vector<bool>, as dereferencing
        // std::vector<bool>::const_iterator does not result in a const bool&
        // due to std::vector's special casing for bool arguments.
        WriteCompactSize(os, v.size());
        for (bool elem : v) {
            ::Serialize(os, elem);
        }
    } else {
        Serialize(os, Using<VectorFormatter<DefaultFormatter>>(v));
    }
}